

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode cf_tcp_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uint uVar1;
  void *pvVar2;
  _Bool _Var3;
  uint uVar4;
  CURLcode CVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  char *pcVar9;
  curltime cVar10;
  char buffer [256];
  char local_138 [264];
  
  if ((cf->field_0x24 & 1) == 0) {
    if (blocking) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    pvVar2 = cf->ctx;
    *done = false;
    iVar8 = *(int *)((long)pvVar2 + 0x98);
    CVar5 = CURLE_COULDNT_CONNECT;
    if (iVar8 == -1) {
      CVar5 = cf_socket_open(cf,data);
      if (CVar5 == CURLE_OK) {
        if ((cf->field_0x24 & 1) != 0) goto LAB_006b3708;
        iVar6 = do_connect((Curl_cfilter *)cf->ctx,data,(_Bool)(SUB41(cf->conn->bits,3) & 1));
        piVar7 = __errno_location();
        iVar8 = *piVar7;
        set_local_ip((Curl_cfilter *)cf->ctx,data);
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
           (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"local address %s port %d...",(long)pvVar2 + 0x114,
                            (ulong)*(uint *)((long)pvVar2 + 0x144));
        }
        if (iVar6 != -1) {
          iVar8 = *(curl_socket_t *)((long)pvVar2 + 0x98);
          CVar5 = CURLE_OK;
          goto LAB_006b3612;
        }
        CVar5 = socket_connect_result(data,(char *)((long)pvVar2 + 0xe0),iVar8);
        goto LAB_006b37e6;
      }
    }
    else {
LAB_006b3612:
      uVar4 = Curl_socket_check(-1,-1,iVar8,0);
      if (uVar4 != 2) {
        if (uVar4 == 0) {
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (((data->set).field_0x8bd & 0x10) == 0) {
            return CURLE_OK;
          }
          if (cf->cft->log_level < 1) {
            return CURLE_OK;
          }
          pcVar9 = "not connected yet";
          goto LAB_006b37bf;
        }
        if (((cf->conn->bits).field_0x3 & 1) == 0) {
          if ((uVar4 & 4) == 0) goto LAB_006b37e6;
          verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x178));
          CVar5 = CURLE_COULDNT_CONNECT;
          goto LAB_006b37ee;
        }
      }
      _Var3 = verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x178));
      if (_Var3) {
        cVar10 = Curl_now();
        *(time_t *)((long)pvVar2 + 0x158) = cVar10.tv_sec;
        *(int *)((long)pvVar2 + 0x160) = cVar10.tv_usec;
        set_local_ip((Curl_cfilter *)cf->ctx,data);
        *done = true;
        cf->field_0x24 = cf->field_0x24 | 1;
        if (data == (Curl_easy *)0x0) {
          return CURLE_OK;
        }
        if (((data->set).field_0x8bd & 0x10) == 0) {
          return CURLE_OK;
        }
        if (cf->cft->log_level < 1) {
          return CURLE_OK;
        }
        pcVar9 = "connected";
LAB_006b37bf:
        Curl_trc_cf_infof(data,cf,pcVar9);
        return CURLE_OK;
      }
LAB_006b37e6:
      if (CVar5 == CURLE_OK) goto LAB_006b370c;
    }
LAB_006b37ee:
    if (*(int *)((long)pvVar2 + 0x178) != 0) {
      set_local_ip((Curl_cfilter *)cf->ctx,data);
      iVar8 = *(int *)((long)pvVar2 + 0x178);
      (data->state).os_errno = iVar8;
      piVar7 = __errno_location();
      *piVar7 = iVar8;
      if (((data->set).field_0x8bd & 0x10) != 0) {
        uVar4 = *(uint *)((long)pvVar2 + 0x110);
        uVar1 = *(uint *)((long)pvVar2 + 0x144);
        pcVar9 = Curl_strerror(iVar8,local_138,0x100);
        Curl_infof(data,"connect to %s port %u from %s port %d failed: %s",(long)pvVar2 + 0xe0,
                   (ulong)uVar4,(long)pvVar2 + 0x114,(ulong)uVar1,pcVar9);
      }
    }
    if (*(int *)((long)pvVar2 + 0x98) != -1) {
      socket_close(data,cf->conn,1,*(int *)((long)pvVar2 + 0x98));
      *(undefined4 *)((long)pvVar2 + 0x98) = 0xffffffff;
    }
    *done = false;
  }
  else {
LAB_006b3708:
    *done = true;
LAB_006b370c:
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

static CURLcode cf_tcp_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_COULDNT_CONNECT;
  int rc = 0;

  (void)data;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* TODO: need to support blocking connect? */
  if(blocking)
    return CURLE_UNSUPPORTED_PROTOCOL;

  *done = FALSE; /* a very negative world view is best */
  if(ctx->sock == CURL_SOCKET_BAD) {
    int error;

    result = cf_socket_open(cf, data);
    if(result)
      goto out;

    if(cf->connected) {
      *done = TRUE;
      return CURLE_OK;
    }

    /* Connect TCP socket */
    rc = do_connect(cf, data, cf->conn->bits.tcp_fastopen);
    error = SOCKERRNO;
    set_local_ip(cf, data);
    CURL_TRC_CF(data, cf, "local address %s port %d...",
                ctx->l_ip, ctx->l_port);
    if(-1 == rc) {
      result = socket_connect_result(data, ctx->r_ip, error);
      goto out;
    }
  }

#ifdef mpeix
  /* Call this function once now, and ignore the results. We do this to
     "clear" the error state on the socket so that we can later read it
     reliably. This is reported necessary on the MPE/iX operating
     system. */
  (void)verifyconnect(ctx->sock, NULL);
#endif
  /* check socket for connect */
  rc = SOCKET_WRITABLE(ctx->sock, 0);

  if(rc == 0) { /* no connection yet */
    CURL_TRC_CF(data, cf, "not connected yet");
    return CURLE_OK;
  }
  else if(rc == CURL_CSELECT_OUT || cf->conn->bits.tcp_fastopen) {
    if(verifyconnect(ctx->sock, &ctx->error)) {
      /* we are connected with TCP, awesome! */
      ctx->connected_at = Curl_now();
      set_local_ip(cf, data);
      *done = TRUE;
      cf->connected = TRUE;
      CURL_TRC_CF(data, cf, "connected");
      return CURLE_OK;
    }
  }
  else if(rc & CURL_CSELECT_ERR) {
    (void)verifyconnect(ctx->sock, &ctx->error);
    result = CURLE_COULDNT_CONNECT;
  }

out:
  if(result) {
    if(ctx->error) {
      set_local_ip(cf, data);
      data->state.os_errno = ctx->error;
      SET_SOCKERRNO(ctx->error);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      {
        char buffer[STRERROR_LEN];
        infof(data, "connect to %s port %u from %s port %d failed: %s",
              ctx->r_ip, ctx->r_port, ctx->l_ip, ctx->l_port,
              Curl_strerror(ctx->error, buffer, sizeof(buffer)));
      }
#endif
    }
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
    *done = FALSE;
  }
  return result;
}